

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O3

ALLEGRO_BITMAP ** reserve_local_bitmap(char *name,BmpType bmp_type)

{
  long lVar1;
  ALLEGRO_USTR *pAVar2;
  Bitmap *pBVar3;
  
  lVar1 = (long)num_global_bitmaps;
  if (lVar1 < 0x80) {
    pBVar3 = bitmaps + lVar1;
    lVar1 = lVar1 + -0x80;
    do {
      if (pBVar3->name == (ALLEGRO_USTR *)0x0) {
        pAVar2 = (ALLEGRO_USTR *)al_ustr_new();
        pBVar3->name = pAVar2;
        return pBVar3->bitmap + bmp_type;
      }
      pBVar3 = pBVar3 + 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  fatal_error("bitmap limit reached");
}

Assistant:

static ALLEGRO_BITMAP **reserve_local_bitmap(const char *name, BmpType bmp_type)
{
   int i;

   for (i = num_global_bitmaps; i < MAX_BITMAPS; i++) {
      if (!bitmaps[i].name) {
         bitmaps[i].name = al_ustr_new(name);
         return &bitmaps[i].bitmap[bmp_type];
      }
   }

   fatal_error("bitmap limit reached");
   return NULL;
}